

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O0

void duckdb::ArrowTableFunction::ArrowToDuckDB
               (ArrowScanLocalState *scan_state,arrow_column_map_t *arrow_convert_data,
               DataChunk *output,idx_t start,bool arrow_scan_is_projected,idx_t rowid_column_index)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  idx_t iVar4;
  reference pvVar5;
  ArrowArrayWrapper *pAVar6;
  undefined8 uVar7;
  ArrowScanLocalState *scan_state_00;
  DataChunk *in_RDX;
  Vector *in_RDI;
  byte in_R8B;
  ulong in_R9;
  ArrowType *unaff_retaddr;
  idx_t in_stack_00000008;
  ArrowArrayScanState *in_stack_00000010;
  ArrowArray *in_stack_00000018;
  Vector *in_stack_00000020;
  ValidityMask *in_stack_00000030;
  uint64_t in_stack_00000038;
  int64_t in_stack_000000a8;
  ArrowType *in_stack_000000b0;
  idx_t in_stack_000000b8;
  ArrowArrayScanState *in_stack_000000c0;
  ArrowArray *in_stack_000000c8;
  Vector *in_stack_000000d0;
  ValidityMask *in_stack_000000e0;
  uint64_t in_stack_000000e8;
  ArrowArrayPhysicalType array_physical_type;
  ArrowArrayScanState *array_state;
  ArrowType *arrow_type;
  ArrowArray *array;
  ArrowArray *parent_array;
  unsigned_long arrow_array_idx;
  unsigned_long col_idx;
  idx_t idx;
  undefined1 in_stack_00000a27;
  int64_t in_stack_00000a28;
  ArrowType *in_stack_00000a30;
  idx_t in_stack_00000a38;
  ArrowArrayScanState *in_stack_00000a40;
  ArrowArray *in_stack_00000a48;
  Vector *in_stack_00000a50;
  ValidityMask *in_stack_00000a60;
  uint64_t in_stack_00000a68;
  ArrowType *in_stack_fffffffffffffe38;
  size_type __n;
  unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>_>
  *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe50;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> *in_stack_fffffffffffffe58;
  allocator *paVar8;
  ArrowArray *array_00;
  ArrowArrayScanState *in_stack_fffffffffffffea0;
  ArrowScanLocalState *in_stack_fffffffffffffea8;
  ulong local_110;
  ulong local_108;
  allocator local_f1;
  string local_f0 [39];
  ArrowArrayPhysicalType local_c9;
  ArrowArrayScanState *local_c8;
  type local_c0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [35];
  undefined1 local_8d;
  allocator local_79;
  string local_78 [32];
  ArrowArray *local_58;
  ArrowArrayWrapper *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  byte local_21;
  DataChunk *local_18;
  Vector *pVVar9;
  
  local_21 = in_R8B & 1;
  local_38 = 0;
  local_30 = in_R9;
  local_18 = in_RDX;
  do {
    uVar2 = local_38;
    iVar4 = DataChunk::ColumnCount((DataChunk *)0x14771c4);
    if (iVar4 <= uVar2) {
      return;
    }
    bVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (in_stack_fffffffffffffe50);
    if (bVar3) {
      local_108 = local_38;
    }
    else {
      pvVar5 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)in_stack_fffffffffffffe40,
                          (size_type)in_stack_fffffffffffffe38);
      local_108 = *pvVar5;
    }
    local_40 = local_108;
    if ((local_21 & 1) == 0) {
      local_110 = local_108;
    }
    else {
      local_110 = local_38;
    }
    local_48 = local_110;
    if (local_30 == 0xffffffffffffffff) {
      if (local_108 != 0xffffffffffffffff) goto LAB_01477304;
    }
    else {
      if (local_108 == 0xffffffffffffffff) {
        local_48 = local_30;
      }
      else if (local_30 <= local_108) {
        local_40 = local_108 + 1;
        local_48 = local_110 + 1;
      }
LAB_01477304:
      local_50 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->
                           ((shared_ptr<duckdb::ArrowArrayWrapper,_true> *)in_stack_fffffffffffffe40
                           );
      pAVar6 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->
                         ((shared_ptr<duckdb::ArrowArrayWrapper,_true> *)in_stack_fffffffffffffe40);
      local_58 = (pAVar6->arrow_array).children[local_48];
      if (local_58->release == (_func_void_ArrowArray_ptr *)0x0) {
        local_8d = 1;
        uVar7 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_78,"arrow_scan: released array passed",&local_79);
        InvalidInputException::InvalidInputException
                  ((InvalidInputException *)in_stack_fffffffffffffe40,
                   (string *)in_stack_fffffffffffffe38);
        local_8d = 0;
        __cxa_throw(uVar7,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      lVar1 = local_58->length;
      pAVar6 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->
                         ((shared_ptr<duckdb::ArrowArrayWrapper,_true> *)in_stack_fffffffffffffe40);
      if (lVar1 != (pAVar6->arrow_array).length) {
        local_b2 = 1;
        uVar7 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_b0,"arrow_scan: array length mismatch",&local_b1);
        InvalidInputException::InvalidInputException
                  ((InvalidInputException *)in_stack_fffffffffffffe40,
                   (string *)in_stack_fffffffffffffe38);
        local_b2 = 0;
        __cxa_throw(uVar7,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      ::std::
      unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>_>
      ::at(in_stack_fffffffffffffe40,(key_type *)in_stack_fffffffffffffe38);
      local_c0 = shared_ptr<duckdb::ArrowType,_true>::operator*
                           ((shared_ptr<duckdb::ArrowType,_true> *)in_stack_fffffffffffffe40);
      local_c8 = ArrowScanLocalState::GetState
                           (in_stack_fffffffffffffea8,(idx_t)in_stack_fffffffffffffea0);
      bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                        ((shared_ptr<duckdb::ArrowArrayWrapper,_true> *)0x14775c0);
      if (!bVar3) {
        shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=
                  (in_stack_fffffffffffffe58,
                   (shared_ptr<duckdb::ArrowArrayWrapper,_true> *)in_stack_fffffffffffffe50);
      }
      local_c9 = anon_unknown_2::GetArrowArrayPhysicalType(in_stack_fffffffffffffe38);
      if (local_c9 == DICTIONARY_ENCODED) {
        in_stack_fffffffffffffea8 =
             (ArrowScanLocalState *)
             vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe40,
                        (size_type)in_stack_fffffffffffffe38);
        DataChunk::size(local_18);
        in_stack_fffffffffffffe38 = (ArrowType *)0x0;
        in_stack_fffffffffffffe40 =
             (unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>_>
              *)0x0;
        ColumnArrowToDuckDBDictionary
                  (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                   in_stack_000000b0,in_stack_000000a8,in_stack_000000e0,in_stack_000000e8);
      }
      else if (local_c9 == RUN_END_ENCODED) {
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe40,
                   (size_type)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffea0 = local_c8;
        DataChunk::size(local_18);
        in_stack_fffffffffffffe38 = (ArrowType *)0x0;
        in_stack_fffffffffffffe40 =
             (unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>_>
              *)0x0;
        ColumnArrowToDuckDBRunEndEncoded
                  (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                   unaff_retaddr,(int64_t)in_RDI,in_stack_00000030,in_stack_00000038);
      }
      else {
        if (local_c9 != DEFAULT) {
          uVar7 = __cxa_allocate_exception(0x10);
          paVar8 = &local_f1;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_f0,"ArrowArrayPhysicalType not recognized",paVar8);
          NotImplementedException::NotImplementedException
                    ((NotImplementedException *)in_stack_fffffffffffffe40,
                     (string *)in_stack_fffffffffffffe38);
          __cxa_throw(uVar7,&NotImplementedException::typeinfo,
                      NotImplementedException::~NotImplementedException);
        }
        scan_state_00 =
             (ArrowScanLocalState *)
             vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe40,
                        (size_type)in_stack_fffffffffffffe38);
        array_00 = local_58;
        pVVar9 = in_RDI;
        DataChunk::size(local_18);
        __n = (ulong)in_stack_fffffffffffffe38 & 0xffffffff00000000;
        SetValidityMask(in_RDI,array_00,scan_state_00,(idx_t)in_stack_fffffffffffffe58,
                        (int64_t)in_stack_fffffffffffffe50,
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe40,__n);
        DataChunk::size(local_18);
        in_stack_fffffffffffffe38 = (ArrowType *)0x0;
        in_stack_fffffffffffffe40 =
             (unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>_>
              *)0x0;
        in_stack_fffffffffffffe48 = 0;
        ColumnArrowToDuckDB(in_stack_00000a50,in_stack_00000a48,in_stack_00000a40,in_stack_00000a38,
                            in_stack_00000a30,in_stack_00000a28,in_stack_00000a60,in_stack_00000a68,
                            (bool)in_stack_00000a27);
        in_RDI = pVVar9;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void ArrowTableFunction::ArrowToDuckDB(ArrowScanLocalState &scan_state, const arrow_column_map_t &arrow_convert_data,
                                       DataChunk &output, idx_t start, bool arrow_scan_is_projected,
                                       idx_t rowid_column_index) {
	for (idx_t idx = 0; idx < output.ColumnCount(); idx++) {
		auto col_idx = scan_state.column_ids.empty() ? idx : scan_state.column_ids[idx];

		// If projection was not pushed down into the arrow scanner, but projection pushdown is enabled on the
		// table function, we need to use original column ids here.
		auto arrow_array_idx = arrow_scan_is_projected ? idx : col_idx;

		if (rowid_column_index != COLUMN_IDENTIFIER_ROW_ID) {
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				arrow_array_idx = rowid_column_index;
			} else if (col_idx >= rowid_column_index) {
				// Since the rowid column is skipped when the table is bound (its not a named column),
				// we need to shift references forward in the Arrow array by one to match the alignment
				// that DuckDB believes the Arrow array is in.
				col_idx += 1;
				arrow_array_idx += 1;
			}
		} else {
			// If there isn't any defined row_id_index, and we're asked for it, skip the column.
			// This is the incumbent behavior.
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				continue;
			}
		}

		auto &parent_array = scan_state.chunk->arrow_array;
		auto &array = *scan_state.chunk->arrow_array.children[arrow_array_idx];
		if (!array.release) {
			throw InvalidInputException("arrow_scan: released array passed");
		}
		if (array.length != scan_state.chunk->arrow_array.length) {
			throw InvalidInputException("arrow_scan: array length mismatch");
		}

		D_ASSERT(arrow_convert_data.find(col_idx) != arrow_convert_data.end());
		auto &arrow_type = *arrow_convert_data.at(col_idx);
		auto &array_state = scan_state.GetState(col_idx);

		// Make sure this Vector keeps the Arrow chunk alive in case we can zero-copy the data
		if (!array_state.owned_data) {
			array_state.owned_data = scan_state.chunk;
		}

		auto array_physical_type = GetArrowArrayPhysicalType(arrow_type);

		switch (array_physical_type) {
		case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
			ColumnArrowToDuckDBDictionary(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		case ArrowArrayPhysicalType::RUN_END_ENCODED:
			ColumnArrowToDuckDBRunEndEncoded(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		case ArrowArrayPhysicalType::DEFAULT:
			SetValidityMask(output.data[idx], array, scan_state, output.size(), parent_array.offset, -1);
			ColumnArrowToDuckDB(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		default:
			throw NotImplementedException("ArrowArrayPhysicalType not recognized");
		}
	}
}